

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::ComplainAboutMissingTarget
          (cmExportInstallFileGenerator *this,cmGeneratorTarget *depender,
          cmGeneratorTarget *dependee,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *exportFiles)

{
  ostream *poVar1;
  string *psVar2;
  ostringstream *this_00;
  char *pcVar3;
  string_view separator;
  string local_1c0;
  ostringstream e;
  
  this_00 = (ostringstream *)&e;
  std::__cxx11::ostringstream::ostringstream(this_00);
  poVar1 = std::operator<<((ostream *)this_00,"install(EXPORT \"");
  poVar1 = std::operator<<(poVar1,(string *)&this->IEGen->ExportSet->Name);
  poVar1 = std::operator<<(poVar1,"\" ...) ");
  poVar1 = std::operator<<(poVar1,"includes target \"");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(depender);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,"\" which requires target \"");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,"\" ");
  if ((exportFiles->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (exportFiles->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pcVar3 = "that is not in any export set.";
  }
  else {
    poVar1 = std::operator<<((ostream *)&e,
                             "that is not in this export set, but in multiple other export sets: ");
    separator._M_str = ", ";
    separator._M_len = 2;
    cmJoin(&local_1c0,exportFiles,separator,(string_view)ZEXT816(0));
    poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
    std::operator<<(poVar1,".\n");
    std::__cxx11::string::~string((string *)&local_1c0);
    poVar1 = std::operator<<((ostream *)&e,
                             "An exported target cannot depend upon another target which is exported multiple times. Consider consolidating the exports of the \""
                            );
    psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
    this_00 = (ostringstream *)std::operator<<(poVar1,(string *)psVar2);
    pcVar3 = "\" target to a single export.";
  }
  std::operator<<((ostream *)this_00,pcVar3);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmExportInstallFileGenerator::ComplainAboutMissingTarget(
  cmGeneratorTarget const* depender, cmGeneratorTarget const* dependee,
  std::vector<std::string> const& exportFiles)
{
  std::ostringstream e;
  e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
    << "\" ...) "
    << "includes target \"" << depender->GetName()
    << "\" which requires target \"" << dependee->GetName() << "\" ";
  if (exportFiles.empty()) {
    e << "that is not in any export set.";
  } else {
    e << "that is not in this export set, but in multiple other export sets: "
      << cmJoin(exportFiles, ", ") << ".\n";
    e << "An exported target cannot depend upon another target which is "
         "exported multiple times. Consider consolidating the exports of the "
         "\""
      << dependee->GetName() << "\" target to a single export.";
  }
  cmSystemTools::Error(e.str());
}